

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_write_frame(fe_t *fe,mfcc_t *feat,int32 store_pcm)

{
  int32 local_20;
  int32 local_1c;
  int32 is_speech;
  int32 store_pcm_local;
  mfcc_t *feat_local;
  fe_t *fe_local;
  
  local_1c = store_pcm;
  _is_speech = feat;
  feat_local = (mfcc_t *)fe;
  fe_spec_magnitude(fe);
  fe_mel_spec((fe_t *)feat_local);
  fe_track_snr((fe_t *)feat_local,&local_20);
  fe_mel_cep((fe_t *)feat_local,_is_speech);
  fe_lifter((fe_t *)feat_local,_is_speech);
  fe_vad_hangover((fe_t *)feat_local,_is_speech,local_20,local_1c);
  return;
}

Assistant:

void
fe_write_frame(fe_t * fe, mfcc_t * feat, int32 store_pcm)
{
    int32 is_speech;

    fe_spec_magnitude(fe);
    fe_mel_spec(fe);
    fe_track_snr(fe, &is_speech);
    fe_mel_cep(fe, feat);
    fe_lifter(fe, feat);
    fe_vad_hangover(fe, feat, is_speech, store_pcm);
}